

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_movem_32_er_al(void)

{
  uint uVar1;
  uint addr_in;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  addr_in = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
  lVar4 = 0;
  iVar5 = 0;
  do {
    if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
      uVar3 = addr_in;
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar3 = pmmu_translate_addr(addr_in);
      }
      uVar2 = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
      m68ki_cpu.dar[lVar4] = uVar2;
      addr_in = addr_in + 4;
      iVar5 = iVar5 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar5 << ((byte)m68ki_cpu.cyc_movem_l & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_32_er_al(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AL_32();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			REG_DA[i] = m68ki_read_32(ea);
			ea += 4;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_L);
}